

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int transfer_set_resume(TRANSFER_HANDLE transfer,_Bool resume_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE resume_amqp_value;
  TRANSFER_INSTANCE *transfer_instance;
  int result;
  _Bool resume_value_local;
  TRANSFER_HANDLE transfer_local;
  
  if (transfer == (TRANSFER_HANDLE)0x0) {
    transfer_instance._0_4_ = 0x1f46;
  }
  else {
    item_value = amqpvalue_create_boolean(resume_value);
    if (item_value == (AMQP_VALUE)0x0) {
      transfer_instance._0_4_ = 0x1f4e;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(transfer->composite_value,8,item_value);
      if (iVar1 == 0) {
        transfer_instance._0_4_ = 0;
      }
      else {
        transfer_instance._0_4_ = 0x1f54;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return (int)transfer_instance;
}

Assistant:

int transfer_set_resume(TRANSFER_HANDLE transfer, bool resume_value)
{
    int result;

    if (transfer == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        TRANSFER_INSTANCE* transfer_instance = (TRANSFER_INSTANCE*)transfer;
        AMQP_VALUE resume_amqp_value = amqpvalue_create_boolean(resume_value);
        if (resume_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(transfer_instance->composite_value, 8, resume_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(resume_amqp_value);
        }
    }

    return result;
}